

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O2

void __thiscall tst_qpromise_finally::fulfilledSync(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  PromiseData<int> *pPVar6;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_148;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_138;
  _Any_data local_130;
  undefined **local_120;
  PromiseData<int> *local_118;
  PromiseResolver<int> resolver;
  QPromiseBase<int> local_100;
  int value;
  QPromiseBase<int> local_e8;
  QPromise<int> p_1;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_b8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_b0;
  function<void_(const_int_&)> local_a8;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<int> local_38;
  
  value = -1;
  local_7c = 0x2a;
  QtPromise::QPromise<int>::resolve((QPromise<int> *)&local_38,&local_7c);
  p_1.super_QPromiseBase<int>.m_d.d = local_38.m_d.d;
  if (local_38.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  local_100._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a58;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00126b90;
  local_100.m_d.d = pPVar6;
  local_a8.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_a8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_a8);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_148.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_148 = resolver.m_d.d;
  }
  local_138.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_148.d != (Data *)0x0) {
    LOCK();
    ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_130._M_unused._0_8_ = resolver.m_d.d;
  local_130._8_8_ = local_148.d;
  local_120 = (undefined **)&value;
  local_e8._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_130._M_unused._M_object;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_130._8_8_;
  if ((Data *)local_130._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_58._M_unused._0_8_ + 0x10) = local_120;
  pcStack_40 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_finally::fulfilledSync()::$_0,void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_finally::fulfilledSync()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_130._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  local_130._M_unused._M_object = local_e8._vptr_QPromiseBase;
  if ((Data *)local_e8._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130._8_8_ = local_148.d;
  if (local_148.d != (Data *)0x0) {
    LOCK();
    ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_120 = (undefined **)&value;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_130._M_unused._M_object;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_130._8_8_;
  if ((Data *)local_130._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_120;
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_finally::fulfilledSync()::$_0,void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_finally::fulfilledSync()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_130._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_148);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_e8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_100._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p_1.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
    ;
  }
  local_e8.m_d.d = p_1.super_QPromiseBase<int>.m_d.d;
  if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a58;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_00126b90;
  p.super_QPromiseBase<int>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
  QVar2.d = local_100.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_148.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_148 = resolver_1.m_d.d;
  }
  local_138.d = (Data *)0x0;
  if (local_148.d == (Data *)0x0) {
    local_130._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_130._8_8_ = local_148.d;
  }
  local_b8.d = (Data *)0x0;
  if (local_148.d != (Data *)0x0) {
    LOCK();
    ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_130._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_130._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_130._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = local_e8.m_d.d;
  if (local_e8.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_e8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120 = &PTR__QPromiseBase_00126b90;
  local_a8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a8._M_invoker = (_Invoker_type)0x0;
  local_130._M_unused._0_8_ = (undefined8)local_148.d;
  local_b0.d = (Data *)local_130._8_8_;
  local_a8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_a8.super__Function_base._M_functor._M_unused._0_8_ = local_130._M_unused._M_object
  ;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_a8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_130._8_8_;
  if ((Data *)local_130._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_a8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126a58;
  *(PromiseData<int> **)((long)local_a8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_118;
  if (local_118 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(local_118->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_a8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126b90;
  local_a8._M_invoker =
       std::
       _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
       ::_M_invoke;
  local_a8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<int,QtPromise::QPromiseBase<int>::finally<tst_qpromise_finally::fulfilledSync()::$_0>(tst_qpromise_finally::fulfilledSync()::$_0)const::{lambda(int_const&)#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_qpromise_finally::fulfilledSync()::$_0>(tst_qpromise_finally::fulfilledSync()::$_0)const::{lambda(int_const&)#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_130._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_a8);
  std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  QVar2.d = local_100.m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_130,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_148,
             (QPromiseResolve<int> *)&local_b0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_130);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_148);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_e8);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_100);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p_1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_38);
  resolver.m_d.d._0_4_ = 0xffffffff;
  iVar5 = waitForValue<int>(&p,(int *)&resolver);
  cVar4 = QTest::qCompare(iVar5,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x2c);
  if (cVar4 != '\0') {
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    resolver.m_d.d._0_1_ = bVar3;
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver,(bool *)&p_1,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x2d);
    if (bVar3) {
      QTest::qCompare(value,8,"value","8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                      ,0x2e);
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledSync()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, 8);
}